

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

field<discordpp::WelcomeScreen> * __thiscall
discordpp::field<discordpp::WelcomeScreen>::operator=
          (field<discordpp::WelcomeScreen> *this,field<discordpp::WelcomeScreen> *f)

{
  _Head_base<0UL,_discordpp::WelcomeScreen_*,_false> _Var1;
  _Head_base<0UL,_discordpp::WelcomeScreen_*,_false> _Var2;
  pointer *__ptr;
  
  _Var1._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<discordpp::WelcomeScreen,_std::default_delete<discordpp::WelcomeScreen>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::WelcomeScreen_*,_std::default_delete<discordpp::WelcomeScreen>_>
       .super__Head_base<0UL,_discordpp::WelcomeScreen_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (WelcomeScreen *)0x0) {
    _Var2._M_head_impl = (WelcomeScreen *)0x0;
  }
  else {
    _Var2._M_head_impl = (WelcomeScreen *)operator_new(0x28);
    field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
              (&((_Var2._M_head_impl)->description).
                super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ,(field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&(_Var1._M_head_impl)->description + 8));
    ((_Var2._M_head_impl)->description)._vptr_nullable_field = (_func_int **)&PTR_operator__0024a208
    ;
    field<std::vector<discordpp::WelcomeScreenChannel,_std::allocator<discordpp::WelcomeScreenChannel>_>_>
    ::field(&(_Var2._M_head_impl)->welcome_channels,&(_Var1._M_head_impl)->welcome_channels);
  }
  _Var1._M_head_impl =
       (this->t_)._M_t.
       super___uniq_ptr_impl<discordpp::WelcomeScreen,_std::default_delete<discordpp::WelcomeScreen>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::WelcomeScreen_*,_std::default_delete<discordpp::WelcomeScreen>_>
       .super__Head_base<0UL,_discordpp::WelcomeScreen_*,_false>._M_head_impl;
  (this->t_)._M_t.
  super___uniq_ptr_impl<discordpp::WelcomeScreen,_std::default_delete<discordpp::WelcomeScreen>_>.
  _M_t.
  super__Tuple_impl<0UL,_discordpp::WelcomeScreen_*,_std::default_delete<discordpp::WelcomeScreen>_>
  .super__Head_base<0UL,_discordpp::WelcomeScreen_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (WelcomeScreen *)0x0) {
    std::default_delete<discordpp::WelcomeScreen>::operator()
              ((default_delete<discordpp::WelcomeScreen> *)this,_Var1._M_head_impl);
  }
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }